

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# address.cpp
# Opt level: O0

vector<ipv4_address,_std::allocator<ipv4_address>_> *
ipv4_address::resolve
          (vector<ipv4_address,_std::allocator<ipv4_address>_> *__return_storage_ptr__,
          string *hostname)

{
  char *pcVar1;
  ostream *poVar2;
  runtime_error *this;
  ipv4_address local_224;
  addrinfo *local_220;
  addrinfo *i;
  string local_210 [48];
  stringstream local_1e0 [8];
  stringstream ss;
  ostream local_1d0 [380];
  int local_54;
  addrinfo *paStack_50;
  int res;
  addrinfo *list_head;
  addrinfo hints;
  string *hostname_local;
  vector<ipv4_address,_std::allocator<ipv4_address>_> *r;
  
  hints.ai_next = (addrinfo *)hostname;
  memset(&list_head,0,0x30);
  list_head._4_4_ = 2;
  hints.ai_flags = 1;
  pcVar1 = (char *)std::__cxx11::string::c_str();
  local_54 = getaddrinfo(pcVar1,(char *)0x0,(addrinfo *)&list_head,&stack0xffffffffffffffb0);
  if (local_54 != 0) {
    std::__cxx11::stringstream::stringstream(local_1e0);
    poVar2 = std::operator<<(local_1d0,"can not resolve server \'");
    poVar2 = std::operator<<(poVar2,(string *)hints.ai_next);
    poVar2 = std::operator<<(poVar2,"\': ");
    pcVar1 = gai_strerror(local_54);
    std::operator<<(poVar2,pcVar1);
    i._7_1_ = 1;
    this = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringstream::str();
    std::runtime_error::runtime_error(this,local_210);
    i._7_1_ = 0;
    __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  i._6_1_ = 0;
  std::vector<ipv4_address,_std::allocator<ipv4_address>_>::vector(__return_storage_ptr__);
  local_220 = paStack_50;
  while( true ) {
    if (local_220 == (addrinfo *)0x0) {
      freeaddrinfo(paStack_50);
      return __return_storage_ptr__;
    }
    if (local_220->ai_family != 2) break;
    if (local_220->ai_socktype != 1) {
      __assert_fail("i->ai_socktype == SOCK_STREAM",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/sorokin[P]echo/address.cpp"
                    ,0x43,
                    "static std::vector<ipv4_address> ipv4_address::resolve(const std::string &)");
    }
    ipv4_address(&local_224,*(uint32_t *)(local_220->ai_addr->sa_data + 2));
    std::vector<ipv4_address,_std::allocator<ipv4_address>_>::push_back
              (__return_storage_ptr__,&local_224);
    local_220 = local_220->ai_next;
  }
  __assert_fail("i->ai_family == AF_INET",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/sorokin[P]echo/address.cpp"
                ,0x42,"static std::vector<ipv4_address> ipv4_address::resolve(const std::string &)")
  ;
}

Assistant:

std::vector<ipv4_address> ipv4_address::resolve(std::string const& hostname)
{
    addrinfo hints{};
    hints.ai_family = AF_INET;
    hints.ai_socktype = SOCK_STREAM;

    addrinfo* list_head;
    int res = getaddrinfo(hostname.c_str(), nullptr, &hints, &list_head);
    if (res != 0)
    {
        std::stringstream ss;
        ss << "can not resolve server '" << hostname << "': " << gai_strerror(res);
        throw std::runtime_error(ss.str());
    }

    std::vector<ipv4_address> r;

    for (addrinfo* i = list_head; i != nullptr; i = i->ai_next)
    {
        assert(i->ai_family == AF_INET);
        assert(i->ai_socktype == SOCK_STREAM);
        r.push_back(ipv4_address{reinterpret_cast<sockaddr_in const*>(i->ai_addr)->sin_addr.s_addr});
    }

    // TODO: move to destructor
    freeaddrinfo(list_head);

    return r;
}